

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O3

QDataStream * QtPrivate::readArrayBasedContainer<QList<Qt::Key>>(QDataStream *s,QList<Qt::Key> *c)

{
  QDataStream QVar1;
  char cVar2;
  undefined1 *asize;
  long in_FS_OFFSET;
  quint32 first;
  undefined1 *local_40;
  uint local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QVar1 = s[0x13];
  cVar2 = QDataStream::isDeviceTransactionStarted();
  if (cVar2 == '\0') {
    QDataStream::resetStatus();
  }
  QList<Qt::Key>::clear(c);
  local_34 = 0xaaaaaaaa;
  QDataStream::operator>>(s,(int *)&local_34);
  asize = (undefined1 *)(ulong)local_34;
  if (asize == (undefined1 *)0xfffffffe) {
    if (0x15 < *(int *)(s + 0x18)) {
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      QDataStream::operator>>(s,(longlong *)&local_40);
      asize = local_40;
      if ((long)local_40 < 0) goto LAB_00307b7d;
    }
  }
  else if (local_34 == 0xffffffff) {
LAB_00307b7d:
    QDataStream::setStatus((Status)s);
    goto LAB_00307c16;
  }
  QList<Qt::Key>::reserve(c,(qsizetype)asize);
  if (asize != (undefined1 *)0x0) {
    do {
      local_40 = (undefined1 *)CONCAT44(local_40._4_4_,0xaaaaaaaa);
      QDataStream::operator>>(s,(int *)&local_40);
      if (s[0x13] != (QDataStream)0x0) {
        QList<Qt::Key>::clear(c);
        break;
      }
      QPodArrayOps<Qt::Key>::emplace<Qt::Key&>
                ((QPodArrayOps<Qt::Key> *)c,(c->d).size,(Key *)&local_40);
      QList<Qt::Key>::end(c);
      asize = asize + -1;
    } while (asize != (undefined1 *)0x0);
  }
LAB_00307c16:
  if (QVar1 != (QDataStream)0x0) {
    QDataStream::resetStatus();
    QDataStream::setStatus((Status)s);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return s;
}

Assistant:

QDataStream &readArrayBasedContainer(QDataStream &s, Container &c)
{
    StreamStateSaver stateSaver(&s);

    c.clear();
    qint64 size = QDataStream::readQSizeType(s);
    qsizetype n = size;
    if (size != n || size < 0) {
        s.setStatus(QDataStream::SizeLimitExceeded);
        return s;
    }
    c.reserve(n);
    for (qsizetype i = 0; i < n; ++i) {
        typename Container::value_type t;
        s >> t;
        if (s.status() != QDataStream::Ok) {
            c.clear();
            break;
        }
        c.append(t);
    }

    return s;
}